

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O3

DirHandle * tryOpenDir(PHYSFS_Io *io,PHYSFS_Archiver *funcs,char *d,int forWriting,int *_claimed)

{
  int iVar1;
  void *pvVar2;
  DirHandle *pDVar3;
  
  if ((io != (PHYSFS_Io *)0x0) && (iVar1 = (*io->seek)(io,0), iVar1 == 0)) {
    return (DirHandle *)0x0;
  }
  pvVar2 = (*funcs->openArchive)(io,d,forWriting,_claimed);
  if (pvVar2 != (void *)0x0) {
    pDVar3 = (DirHandle *)(*__PHYSFS_AllocatorHooks.Malloc)(0x38);
    if (pDVar3 != (DirHandle *)0x0) {
      pDVar3->funcs = (PHYSFS_Archiver *)0x0;
      pDVar3->next = (__PHYSFS_DIRHANDLE__ *)0x0;
      pDVar3->root = (char *)0x0;
      pDVar3->rootlen = 0;
      pDVar3->dirName = (char *)0x0;
      pDVar3->mountPoint = (char *)0x0;
      pDVar3->funcs = funcs;
      pDVar3->opaque = pvVar2;
      return pDVar3;
    }
    (*funcs->closeArchive)(pvVar2);
  }
  return (DirHandle *)0x0;
}

Assistant:

static DirHandle *tryOpenDir(PHYSFS_Io *io, const PHYSFS_Archiver *funcs,
                             const char *d, int forWriting, int *_claimed)
{
    DirHandle *retval = NULL;
    void *opaque = NULL;

    if (io != NULL)
        BAIL_IF_ERRPASS(!io->seek(io, 0), NULL);

    opaque = funcs->openArchive(io, d, forWriting, _claimed);
    if (opaque != NULL)
    {
        retval = (DirHandle *) allocator.Malloc(sizeof (DirHandle));
        if (retval == NULL)
            funcs->closeArchive(opaque);
        else
        {
            memset(retval, '\0', sizeof (DirHandle));
            retval->mountPoint = NULL;
            retval->funcs = funcs;
            retval->opaque = opaque;
        } /* else */
    } /* if */

    return retval;
}